

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.cpp
# Opt level: O0

void __thiscall tl::StrT<char>::append(StrT<char> *this,CStrT<char> o)

{
  char cVar1;
  u32 uVar2;
  u32 uVar3;
  char *pcVar4;
  uint local_38;
  uint local_34;
  u32 i_1;
  u32 i;
  char *newStr;
  u32 newSize;
  StrT<char> *this_local;
  CStrT<char> o_local;
  
  o_local._0_8_ = o._str;
  this_local._0_4_ = o._size;
  uVar3 = this->_size;
  uVar2 = CStrT<char>::size((CStrT<char> *)&this_local);
  uVar3 = uVar3 + uVar2;
  pcVar4 = growIfNeeded(this,uVar3);
  if (pcVar4 != (char *)0x0) {
    for (local_34 = 0; local_34 < this->_size; local_34 = local_34 + 1) {
      pcVar4[local_34] = this->_str[local_34];
    }
    if ((this->_str != &s_emptyStr<char>) && (this->_str != (char *)0x0)) {
      operator_delete__(this->_str);
    }
    this->_str = pcVar4;
  }
  for (local_38 = 0; uVar2 = CStrT<char>::size((CStrT<char> *)&this_local), local_38 < uVar2;
      local_38 = local_38 + 1) {
    cVar1 = CStrT<char>::operator[]((CStrT<char> *)&this_local,local_38);
    this->_str[this->_size + local_38] = cVar1;
  }
  this->_str[uVar3] = '\0';
  this->_size = uVar3;
  return;
}

Assistant:

void StrT<CharT>::append(CStrT<CharT> o)
{
    const u32 newSize = _size + o.size();
    CharT *const newStr = growIfNeeded(newSize);
    if(newStr) {
        for(u32 i=0; i<_size; i++) {
            newStr[i] = _str[i];
        }
        if(_str != s_emptyStr<CharT>) {
            delete[] _str;
        }
        _str = newStr;
    }
    for(u32 i=0; i<o.size(); i++) {
        _str[_size+i] = o[i];
    }
    _str[newSize] = 0;
    _size = newSize;
}